

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O2

void artifact_exists(obj *otmp,char *name,boolean mod)

{
  artifact *paVar1;
  int iVar2;
  short sVar3;
  long lVar4;
  char cVar5;
  ulong uVar6;
  
  paVar1 = artilist;
  if ((otmp != (obj *)0x0) && (*name != '\0')) {
    lVar4 = 0x100000000;
    for (uVar6 = 0x40; sVar3 = *(short *)((long)&paVar1->otyp + uVar6), sVar3 != 0;
        uVar6 = uVar6 + 0x40) {
      if ((sVar3 == otmp->otyp) &&
         (iVar2 = strcmp(*(char **)((long)&paVar1->name + uVar6),name), iVar2 == 0)) {
        if (mod != '\0') {
          strip_oprops(otmp);
          sVar3 = otmp->otyp;
        }
        cVar5 = (char)(uVar6 >> 6);
        if (mod == '\0') {
          cVar5 = '\0';
        }
        otmp->oartifact = cVar5;
        otmp->age = 0;
        if (sVar3 == 0xa4) {
          otmp->spe = '\0';
        }
        artiexist[lVar4 >> 0x20] = mod;
        return;
      }
      lVar4 = lVar4 + 0x100000000;
    }
  }
  return;
}

Assistant:

void artifact_exists(struct obj *otmp, const char *name, boolean mod)
{
	const struct artifact *a;

	if (otmp && *name)
	    for (a = artilist+1; a->otyp; a++)
		if (a->otyp == otmp->otyp && !strcmp(a->name, name)) {
		    int m = a - artilist;
		    if (mod) /* artifacts can't have properties */
			strip_oprops(otmp);
		    otmp->oartifact = (char)(mod ? m : 0);
		    otmp->age = 0;
		    if (otmp->otyp == RIN_INCREASE_DAMAGE)
			otmp->spe = 0;
		    artiexist[m] = mod;
		    break;
		}
	return;
}